

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeCommit(sqlite3 *db,Vdbe *p)

{
  Btree *pBVar1;
  bool bVar2;
  i64 id;
  int iVar3;
  uint uVar4;
  Pager *pPager;
  char *pcVar5;
  bool local_ac;
  Btree *pBt_5;
  Btree *pBt_4;
  char *zFile;
  Btree *pBt_3;
  u32 iRandom;
  int nMainFile;
  int retryCount;
  int res;
  i64 offset;
  sqlite3_file *pMaster;
  char *zMainFile;
  char *zMaster;
  sqlite3 *psStack_50;
  int needSync;
  sqlite3_vfs *pVfs;
  Btree *pBt_2;
  Btree *pBt_1;
  Btree *pBt;
  int needXcommit;
  int rc;
  int nTrans;
  int i;
  Vdbe *p_local;
  sqlite3 *db_local;
  
  needXcommit = 0;
  pBt._4_4_ = 0;
  pBt._0_4_ = 0;
  _nTrans = p;
  p_local = (Vdbe *)db;
  pBt._4_4_ = sqlite3VtabSync(db,&p->zErrMsg);
  rc = 0;
  while( true ) {
    bVar2 = false;
    if (pBt._4_4_ == 0) {
      bVar2 = rc < *(int *)&p_local->pResultSet;
    }
    if (!bVar2) break;
    pBt_1 = (Btree *)(&p_local->aColName->z)[(long)rc * 4];
    iVar3 = sqlite3BtreeIsInTrans(pBt_1);
    if (iVar3 != 0) {
      pBt._0_4_ = 1;
      if (rc != 1) {
        needXcommit = needXcommit + 1;
      }
      sqlite3BtreeEnter(pBt_1);
      pPager = sqlite3BtreePager(pBt_1);
      pBt._4_4_ = sqlite3PagerExclusiveLock(pPager);
      sqlite3BtreeLeave(pBt_1);
    }
    rc = rc + 1;
  }
  if (pBt._4_4_ != 0) {
    return pBt._4_4_;
  }
  if (((int)pBt != 0) && (p_local->pFrame != (VdbeFrame *)0x0)) {
    iVar3 = (*(code *)p_local->pFrame)(p_local->pFree);
    if (iVar3 != 0) {
      return 0x213;
    }
    pBt._4_4_ = 0;
  }
  pcVar5 = sqlite3BtreeGetFilename((Btree *)p_local->aColName->z);
  iVar3 = sqlite3Strlen30(pcVar5);
  if ((iVar3 == 0) || (needXcommit < 2)) {
    rc = 0;
    while( true ) {
      bVar2 = false;
      if (pBt._4_4_ == 0) {
        bVar2 = rc < *(int *)&p_local->pResultSet;
      }
      if (!bVar2) break;
      pBt_2 = (Btree *)(&p_local->aColName->z)[(long)rc * 4];
      if (pBt_2 != (Btree *)0x0) {
        pBt._4_4_ = sqlite3BtreeCommitPhaseOne(pBt_2,(char *)0x0);
      }
      rc = rc + 1;
    }
    rc = 0;
    while( true ) {
      bVar2 = false;
      if (pBt._4_4_ == 0) {
        bVar2 = rc < *(int *)&p_local->pResultSet;
      }
      if (!bVar2) break;
      pVfs = (sqlite3_vfs *)(&p_local->aColName->z)[(long)rc * 4];
      if (pVfs != (sqlite3_vfs *)0x0) {
        pBt._4_4_ = sqlite3BtreeCommitPhaseTwo((Btree *)pVfs,0);
      }
      rc = rc + 1;
    }
    if (pBt._4_4_ == 0) {
      sqlite3VtabCommit((sqlite3 *)p_local);
    }
  }
  else {
    psStack_50 = p_local->db;
    zMaster._4_4_ = 0;
    zMainFile = (char *)0x0;
    pMaster = (sqlite3_file *)sqlite3BtreeGetFilename((Btree *)p_local->aColName->z);
    offset = 0;
    _retryCount = 0;
    iRandom = 0;
    pBt_3._4_4_ = sqlite3Strlen30((char *)pMaster);
    zMainFile = sqlite3MPrintf((sqlite3 *)p_local,"%s-mjXXXXXX9XXz",pMaster);
    if (zMainFile == (char *)0x0) {
      return 7;
    }
    do {
      if (iRandom != 0) {
        if (100 < (int)iRandom) {
          sqlite3_log(0xd,"MJ delete: %s",zMainFile);
          sqlite3OsDelete((sqlite3_vfs *)psStack_50,zMainFile,0);
          break;
        }
        if (iRandom == 1) {
          sqlite3_log(0xd,"MJ collide: %s",zMainFile);
        }
      }
      iRandom = iRandom + 1;
      sqlite3_randomness(4,&pBt_3);
      sqlite3_snprintf(0xd,zMainFile + pBt_3._4_4_,"-mj%06X9%02X",(ulong)((uint)pBt_3 >> 8),
                       (ulong)((uint)pBt_3 & 0xff));
      pBt._4_4_ = sqlite3OsAccess((sqlite3_vfs *)psStack_50,zMainFile,0,&nMainFile);
      local_ac = pBt._4_4_ == 0 && nMainFile != 0;
    } while (local_ac);
    if (pBt._4_4_ == 0) {
      pBt._4_4_ = sqlite3OsOpenMalloc((sqlite3_vfs *)psStack_50,zMainFile,(sqlite3_file **)&offset,
                                      0x4016,(int *)0x0);
    }
    if (pBt._4_4_ != 0) {
      sqlite3DbFree((sqlite3 *)p_local,zMainFile);
      return pBt._4_4_;
    }
    for (rc = 0; rc < *(int *)&p_local->pResultSet; rc = rc + 1) {
      pBVar1 = (Btree *)(&p_local->aColName->z)[(long)rc * 4];
      iVar3 = sqlite3BtreeIsInTrans(pBVar1);
      if ((iVar3 != 0) && (pcVar5 = sqlite3BtreeGetJournalname(pBVar1), pcVar5 != (char *)0x0)) {
        if ((zMaster._4_4_ == 0) && (iVar3 = sqlite3BtreeSyncDisabled(pBVar1), iVar3 == 0)) {
          zMaster._4_4_ = 1;
        }
        id = offset;
        iVar3 = sqlite3Strlen30(pcVar5);
        pBt._4_4_ = sqlite3OsWrite((sqlite3_file *)id,pcVar5,iVar3 + 1,_retryCount);
        iVar3 = sqlite3Strlen30(pcVar5);
        _retryCount = (iVar3 + 1) + _retryCount;
        if (pBt._4_4_ != 0) {
          sqlite3OsCloseFree((sqlite3_file *)offset);
          sqlite3OsDelete((sqlite3_vfs *)psStack_50,zMainFile,0);
          sqlite3DbFree((sqlite3 *)p_local,zMainFile);
          return pBt._4_4_;
        }
      }
    }
    if (((zMaster._4_4_ != 0) &&
        (uVar4 = sqlite3OsDeviceCharacteristics((sqlite3_file *)offset), (uVar4 & 0x400) == 0)) &&
       (pBt._4_4_ = sqlite3OsSync((sqlite3_file *)offset,2), pBt._4_4_ != 0)) {
      sqlite3OsCloseFree((sqlite3_file *)offset);
      sqlite3OsDelete((sqlite3_vfs *)psStack_50,zMainFile,0);
      sqlite3DbFree((sqlite3 *)p_local,zMainFile);
      return pBt._4_4_;
    }
    rc = 0;
    while( true ) {
      bVar2 = false;
      if (pBt._4_4_ == 0) {
        bVar2 = rc < *(int *)&p_local->pResultSet;
      }
      if (!bVar2) break;
      pBVar1 = (Btree *)(&p_local->aColName->z)[(long)rc * 4];
      if (pBVar1 != (Btree *)0x0) {
        pBt._4_4_ = sqlite3BtreeCommitPhaseOne(pBVar1,zMainFile);
      }
      rc = rc + 1;
    }
    sqlite3OsCloseFree((sqlite3_file *)offset);
    if (pBt._4_4_ != 0) {
      sqlite3DbFree((sqlite3 *)p_local,zMainFile);
      return pBt._4_4_;
    }
    pBt._4_4_ = sqlite3OsDelete((sqlite3_vfs *)psStack_50,zMainFile,1);
    sqlite3DbFree((sqlite3 *)p_local,zMainFile);
    zMainFile = (char *)0x0;
    if (pBt._4_4_ != 0) {
      return pBt._4_4_;
    }
    sqlite3BeginBenignMalloc();
    for (rc = 0; rc < *(int *)&p_local->pResultSet; rc = rc + 1) {
      pBVar1 = (Btree *)(&p_local->aColName->z)[(long)rc * 4];
      if (pBVar1 != (Btree *)0x0) {
        sqlite3BtreeCommitPhaseTwo(pBVar1,1);
      }
    }
    sqlite3EndBenignMalloc();
    sqlite3VtabCommit((sqlite3 *)p_local);
  }
  return pBt._4_4_;
}

Assistant:

static int vdbeCommit(sqlite3 *db, Vdbe *p){
  int i;
  int nTrans = 0;  /* Number of databases with an active write-transaction */
  int rc = SQLITE_OK;
  int needXcommit = 0;

#ifdef SQLITE_OMIT_VIRTUALTABLE
  /* With this option, sqlite3VtabSync() is defined to be simply 
  ** SQLITE_OK so p is not used. 
  */
  UNUSED_PARAMETER(p);
#endif

  /* Before doing anything else, call the xSync() callback for any
  ** virtual module tables written in this transaction. This has to
  ** be done before determining whether a master journal file is 
  ** required, as an xSync() callback may add an attached database
  ** to the transaction.
  */
  rc = sqlite3VtabSync(db, &p->zErrMsg);

  /* This loop determines (a) if the commit hook should be invoked and
  ** (b) how many database files have open write transactions, not 
  ** including the temp database. (b) is important because if more than 
  ** one database file has an open write transaction, a master journal
  ** file is required for an atomic commit.
  */ 
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){ 
    Btree *pBt = db->aDb[i].pBt;
    if( sqlite3BtreeIsInTrans(pBt) ){
      needXcommit = 1;
      if( i!=1 ) nTrans++;
      sqlite3BtreeEnter(pBt);
      rc = sqlite3PagerExclusiveLock(sqlite3BtreePager(pBt));
      sqlite3BtreeLeave(pBt);
    }
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* If there are any write-transactions at all, invoke the commit hook */
  if( needXcommit && db->xCommitCallback ){
    rc = db->xCommitCallback(db->pCommitArg);
    if( rc ){
      return SQLITE_CONSTRAINT_COMMITHOOK;
    }
  }

  /* The simple case - no more than one database file (not counting the
  ** TEMP database) has a transaction active.   There is no need for the
  ** master-journal.
  **
  ** If the return value of sqlite3BtreeGetFilename() is a zero length
  ** string, it means the main database is :memory: or a temp file.  In 
  ** that case we do not support atomic multi-file commits, so use the 
  ** simple case then too.
  */
  if( 0==sqlite3Strlen30(sqlite3BtreeGetFilename(db->aDb[0].pBt))
   || nTrans<=1
  ){
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, 0);
      }
    }

    /* Do the commit only if all databases successfully complete phase 1. 
    ** If one of the BtreeCommitPhaseOne() calls fails, this indicates an
    ** IO error while deleting or truncating a journal file. It is unlikely,
    ** but could happen. In this case abandon processing and return the error.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseTwo(pBt, 0);
      }
    }
    if( rc==SQLITE_OK ){
      sqlite3VtabCommit(db);
    }
  }

  /* The complex case - There is a multi-file write-transaction active.
  ** This requires a master journal file to ensure the transaction is
  ** committed atomicly.
  */
#ifndef SQLITE_OMIT_DISKIO
  else{
    sqlite3_vfs *pVfs = db->pVfs;
    int needSync = 0;
    char *zMaster = 0;   /* File-name for the master journal */
    char const *zMainFile = sqlite3BtreeGetFilename(db->aDb[0].pBt);
    sqlite3_file *pMaster = 0;
    i64 offset = 0;
    int res;
    int retryCount = 0;
    int nMainFile;

    /* Select a master journal file name */
    nMainFile = sqlite3Strlen30(zMainFile);
    zMaster = sqlite3MPrintf(db, "%s-mjXXXXXX9XXz", zMainFile);
    if( zMaster==0 ) return SQLITE_NOMEM;
    do {
      u32 iRandom;
      if( retryCount ){
        if( retryCount>100 ){
          sqlite3_log(SQLITE_FULL, "MJ delete: %s", zMaster);
          sqlite3OsDelete(pVfs, zMaster, 0);
          break;
        }else if( retryCount==1 ){
          sqlite3_log(SQLITE_FULL, "MJ collide: %s", zMaster);
        }
      }
      retryCount++;
      sqlite3_randomness(sizeof(iRandom), &iRandom);
      sqlite3_snprintf(13, &zMaster[nMainFile], "-mj%06X9%02X",
                               (iRandom>>8)&0xffffff, iRandom&0xff);
      /* The antipenultimate character of the master journal name must
      ** be "9" to avoid name collisions when using 8+3 filenames. */
      assert( zMaster[sqlite3Strlen30(zMaster)-3]=='9' );
      sqlite3FileSuffix3(zMainFile, zMaster);
      rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
    }while( rc==SQLITE_OK && res );
    if( rc==SQLITE_OK ){
      /* Open the master journal. */
      rc = sqlite3OsOpenMalloc(pVfs, zMaster, &pMaster, 
          SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|
          SQLITE_OPEN_EXCLUSIVE|SQLITE_OPEN_MASTER_JOURNAL, 0
      );
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zMaster);
      return rc;
    }
 
    /* Write the name of each database file in the transaction into the new
    ** master journal file. If an error occurs at this point close
    ** and delete the master journal file. All the individual journal files
    ** still have 'null' as the master journal pointer, so they will roll
    ** back independently if a failure occurs.
    */
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( sqlite3BtreeIsInTrans(pBt) ){
        char const *zFile = sqlite3BtreeGetJournalname(pBt);
        if( zFile==0 ){
          continue;  /* Ignore TEMP and :memory: databases */
        }
        assert( zFile[0]!=0 );
        if( !needSync && !sqlite3BtreeSyncDisabled(pBt) ){
          needSync = 1;
        }
        rc = sqlite3OsWrite(pMaster, zFile, sqlite3Strlen30(zFile)+1, offset);
        offset += sqlite3Strlen30(zFile)+1;
        if( rc!=SQLITE_OK ){
          sqlite3OsCloseFree(pMaster);
          sqlite3OsDelete(pVfs, zMaster, 0);
          sqlite3DbFree(db, zMaster);
          return rc;
        }
      }
    }

    /* Sync the master journal file. If the IOCAP_SEQUENTIAL device
    ** flag is set this is not required.
    */
    if( needSync 
     && 0==(sqlite3OsDeviceCharacteristics(pMaster)&SQLITE_IOCAP_SEQUENTIAL)
     && SQLITE_OK!=(rc = sqlite3OsSync(pMaster, SQLITE_SYNC_NORMAL))
    ){
      sqlite3OsCloseFree(pMaster);
      sqlite3OsDelete(pVfs, zMaster, 0);
      sqlite3DbFree(db, zMaster);
      return rc;
    }

    /* Sync all the db files involved in the transaction. The same call
    ** sets the master journal pointer in each individual journal. If
    ** an error occurs here, do not delete the master journal file.
    **
    ** If the error occurs during the first call to
    ** sqlite3BtreeCommitPhaseOne(), then there is a chance that the
    ** master journal file will be orphaned. But we cannot delete it,
    ** in case the master journal file name was written into the journal
    ** file before the failure occurred.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){ 
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, zMaster);
      }
    }
    sqlite3OsCloseFree(pMaster);
    assert( rc!=SQLITE_BUSY );
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zMaster);
      return rc;
    }

    /* Delete the master journal file. This commits the transaction. After
    ** doing this the directory is synced again before any individual
    ** transaction files are deleted.
    */
    rc = sqlite3OsDelete(pVfs, zMaster, 1);
    sqlite3DbFree(db, zMaster);
    zMaster = 0;
    if( rc ){
      return rc;
    }

    /* All files and directories have already been synced, so the following
    ** calls to sqlite3BtreeCommitPhaseTwo() are only closing files and
    ** deleting or truncating journals. If something goes wrong while
    ** this is happening we don't really care. The integrity of the
    ** transaction is already guaranteed, but some stray 'cold' journals
    ** may be lying around. Returning an error code won't help matters.
    */
    disable_simulated_io_errors();
    sqlite3BeginBenignMalloc();
    for(i=0; i<db->nDb; i++){ 
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        sqlite3BtreeCommitPhaseTwo(pBt, 1);
      }
    }
    sqlite3EndBenignMalloc();
    enable_simulated_io_errors();

    sqlite3VtabCommit(db);
  }
#endif

  return rc;
}